

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * __thiscall Matrix::operator*=(Matrix *this,Permutation *permutation)

{
  _Vector_base<int,_std::allocator<int>_> _Stack_28;
  
  Permutation::GetInverse((Permutation *)&_Stack_28,permutation);
  ApplyColumnPermutation(this,(Permutation *)&_Stack_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_28);
  return this;
}

Assistant:

Matrix& Matrix::operator*=(const Permutation& permutation) {
  ApplyColumnPermutation(permutation.GetInverse());
  return *this;
}